

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleStringsCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  uint j;
  BOM BVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  undefined7 extraout_var;
  string *psVar11;
  ulong uVar12;
  ulong uVar13;
  ostream *poVar14;
  uint *puVar15;
  uint uVar16;
  char cVar17;
  size_type sVar18;
  uint j_1;
  undefined4 uVar19;
  undefined4 uVar21;
  pointer pbVar22;
  BOM local_558;
  int limit_output;
  uint local_544;
  ulong local_540;
  int limit_input;
  uint local_530;
  uint local_52c;
  string output;
  ulong local_508;
  ulong local_500;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  string fileName;
  string s;
  ifstream fin;
  uint auStack_308 [122];
  string outVar;
  RegularExpression regex;
  undefined4 uVar20;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fin,"STRINGS requires a file name and output variable",
               (allocator<char> *)&s);
    cmCommand::SetError(&this->super_cmCommand,(string *)&fin);
    std::__cxx11::string::~string((string *)&fin);
    return false;
  }
  std::__cxx11::string::string((string *)&fileName,(string *)(pbVar1 + 1));
  bVar4 = cmsys::SystemTools::FileIsFullPath(&fileName);
  if (!bVar4) {
    cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    std::__cxx11::string::_M_assign((string *)&fileName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fin,"/",
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::append((string *)&fileName);
    std::__cxx11::string::~string((string *)&fin);
  }
  std::__cxx11::string::string
            ((string *)&outVar,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 2));
  limit_input = -1;
  limit_output = -1;
  regex.regmatch.startp[0] = (char *)0x0;
  regex.regmatch.endp[0] = (char *)0x0;
  regex.regmatch.searchstring = (char *)0x0;
  regex.program = (char *)0x0;
  bVar4 = true;
  local_544 = 0;
  local_52c = 0;
  local_558 = BOM_None;
  uVar21 = 0;
  local_500 = 0;
  local_508 = 0;
  local_530 = 0;
  for (uVar12 = 3;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar12 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar12 = (ulong)((int)uVar12 + 1)) {
    bVar5 = std::operator==(pbVar1 + uVar12,"LIMIT_INPUT");
    if (bVar5) {
      uVar21 = 1;
      goto LAB_001767e3;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar12,"LIMIT_OUTPUT");
    if (bVar5) {
      uVar21 = 2;
      goto LAB_001767e3;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar12,"LIMIT_COUNT");
    if (bVar5) {
      uVar21 = 3;
      goto LAB_001767e3;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar12,"LENGTH_MINIMUM");
    if (bVar5) {
      uVar21 = 4;
      goto LAB_001767e3;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar12,"LENGTH_MAXIMUM");
    if (bVar5) {
      uVar21 = 5;
      goto LAB_001767e3;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar12,"REGEX");
    if (bVar5) {
      uVar21 = 7;
      goto LAB_001767e3;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar12,"NEWLINE_CONSUME");
    if (bVar5) {
      local_52c = (uint)CONCAT71(extraout_var,1);
      uVar21 = 0;
      goto LAB_001767e3;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar12,"NO_HEX_CONVERSION")
    ;
    uVar20 = 0;
    uVar19 = 0;
    if (bVar5) {
      bVar4 = false;
      uVar21 = uVar20;
      goto LAB_001767e3;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar12,"ENCODING");
    if (bVar5) {
      uVar21 = 8;
      goto LAB_001767e3;
    }
    puVar15 = &switchD_00176866::switchdataD_003d5050;
    switch(uVar21) {
    case 1:
      iVar8 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p,
                              "%d",&limit_input);
      if ((iVar8 != 1) || (uVar21 = 0, limit_input < 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
        poVar14 = std::operator<<((ostream *)&fin,"STRINGS option LIMIT_INPUT value \"");
        poVar14 = std::operator<<(poVar14,(string *)
                                          ((args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + uVar12));
        std::operator<<(poVar14,"\" is not an unsigned integer.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&s);
        goto LAB_001774bc;
      }
      break;
    case 2:
      iVar8 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p,
                              "%d",&limit_output);
      if ((iVar8 != 1) || (uVar21 = 0, limit_output < 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
        poVar14 = std::operator<<((ostream *)&fin,"STRINGS option LIMIT_OUTPUT value \"");
        poVar14 = std::operator<<(poVar14,(string *)
                                          ((args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + uVar12));
        std::operator<<(poVar14,"\" is not an unsigned integer.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&s);
        goto LAB_001774bc;
      }
      break;
    case 3:
      iVar8 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p,
                              "%d",&output);
      if (iVar8 == 1) {
        local_500 = (ulong)output._M_dataplus._M_p & 0xffffffff;
        uVar21 = uVar19;
        if (-1 < (int)(uint)output._M_dataplus._M_p) break;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
      poVar14 = std::operator<<((ostream *)&fin,"STRINGS option LIMIT_COUNT value \"");
      poVar14 = std::operator<<(poVar14,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar12));
      std::operator<<(poVar14,"\" is not an unsigned integer.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&s);
      goto LAB_001774bc;
    case 4:
      iVar8 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p,
                              "%d",&output);
      if (iVar8 == 1) {
        local_530 = (uint)output._M_dataplus._M_p;
        uVar21 = uVar19;
        if (-1 < (int)(uint)output._M_dataplus._M_p) break;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
      poVar14 = std::operator<<((ostream *)&fin,"STRINGS option LENGTH_MINIMUM value \"");
      poVar14 = std::operator<<(poVar14,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar12));
      std::operator<<(poVar14,"\" is not an unsigned integer.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&s);
      goto LAB_001774bc;
    case 5:
      iVar8 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p,
                              "%d",&output);
      if (iVar8 == 1) {
        local_508 = (ulong)output._M_dataplus._M_p & 0xffffffff;
        uVar21 = uVar19;
        if (-1 < (int)(uint)output._M_dataplus._M_p) break;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
      poVar14 = std::operator<<((ostream *)&fin,"STRINGS option LENGTH_MAXIMUM value \"");
      poVar14 = std::operator<<(poVar14,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar12));
      std::operator<<(poVar14,"\" is not an unsigned integer.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&s);
      goto LAB_001774bc;
    default:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
      poVar14 = std::operator<<((ostream *)&fin,"STRINGS given unknown argument \"");
      poVar14 = std::operator<<(poVar14,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar12));
      std::operator<<(poVar14,"\"");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&s);
LAB_001774bc:
      std::__cxx11::string::~string((string *)&s);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fin);
      bVar4 = false;
      goto LAB_001771a3;
    case 7:
      bVar5 = cmsys::RegularExpression::compile
                        (&regex,(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar12);
      local_544 = (uint)CONCAT71((int7)((ulong)puVar15 >> 8),1);
      uVar21 = uVar19;
      if (!bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
        poVar14 = std::operator<<((ostream *)&fin,"STRINGS option REGEX value \"");
        poVar14 = std::operator<<(poVar14,(string *)
                                          ((args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + uVar12));
        std::operator<<(poVar14,"\" could not be compiled.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&s);
        goto LAB_001774bc;
      }
      break;
    case 8:
      bVar5 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar12,"UTF-8");
      if (bVar5) {
        local_558 = BOM_UTF8;
        uVar21 = uVar20;
      }
      else {
        bVar5 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar12,"UTF-16LE");
        if (bVar5) {
          local_558 = BOM_UTF16LE;
          uVar21 = uVar20;
        }
        else {
          bVar5 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12,"UTF-16BE");
          if (bVar5) {
            local_558 = BOM_UTF16BE;
            uVar21 = uVar20;
          }
          else {
            bVar5 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12,"UTF-32LE");
            if (bVar5) {
              local_558 = BOM_UTF32LE;
              uVar21 = uVar20;
            }
            else {
              bVar5 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar12,"UTF-32BE"
                                     );
              local_558 = BOM_UTF32BE;
              uVar21 = uVar19;
              if (!bVar5) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
                poVar14 = std::operator<<((ostream *)&fin,"STRINGS option ENCODING \"");
                poVar14 = std::operator<<(poVar14,(string *)
                                                  ((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar12));
                std::operator<<(poVar14,"\" not recognized.");
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(&this->super_cmCommand,&s);
                goto LAB_001774bc;
              }
            }
          }
        }
      }
    }
LAB_001767e3:
  }
  if (bVar4) {
    psVar11 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)&fin,(string *)psVar11);
    std::__cxx11::string::append((char *)&fin);
    std::__cxx11::string::append((char *)&fin);
    bVar4 = cmHexFileConverter::TryConvert(fileName._M_dataplus._M_p,_fin);
    if (bVar4) {
      std::__cxx11::string::_M_assign((string *)&fileName);
    }
    std::__cxx11::string::~string((string *)&fin);
  }
  std::ifstream::ifstream(&fin,fileName._M_dataplus._M_p,_S_in);
  bVar4 = (*(byte *)((long)auStack_308 + *(long *)(_fin + -0x18)) & 5) == 0;
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    poVar14 = std::operator<<((ostream *)&s,"STRINGS file \"");
    poVar14 = std::operator<<(poVar14,(string *)&fileName);
    std::operator<<(poVar14,"\" cannot be read.");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&output);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
    goto LAB_00177196;
  }
  BVar6 = cmsys::FStream::ReadBOM((istream *)&fin);
  if (BVar6 == BOM_None) {
    BVar6 = local_558;
  }
  if (local_558 != BOM_None) {
    BVar6 = local_558;
  }
  uVar7 = 3;
  if ((BVar6 & ~BOM_UTF8) != BOM_UTF32BE) {
    uVar7 = (uint)((BVar6 & ~BOM_UTF8) == BOM_UTF16BE);
  }
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  s.field_2._M_local_buf[0] = '\0';
  uVar12 = (ulong)local_530;
  local_540 = 0;
  do {
    if (((int)local_500 != 0) &&
       (uVar13 = (long)strings.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)strings.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5, local_500 <= uVar13))
    goto LAB_00177051;
    if (((-1 < limit_input) && (iVar8 = std::istream::tellg(), limit_input <= iVar8)) ||
       ((*(byte *)((long)auStack_308 + *(long *)(_fin + -0x18)) & 5) != 0)) break;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    output._M_dataplus._M_p = (pointer)&output.field_2;
    uVar9 = std::istream::get();
    uVar16 = uVar7;
    while( true ) {
      bVar5 = uVar16 == 0;
      uVar16 = uVar16 - 1;
      cVar17 = (char)&fin;
      if (bVar5) break;
      uVar10 = std::istream::get();
      if ((*(byte *)((long)auStack_308 + *(long *)(_fin + -0x18)) & 5) != 0) {
        std::istream::putback(cVar17);
        break;
      }
      uVar9 = uVar9 << 8 | uVar10;
    }
    if (BVar6 == BOM_UTF32LE) {
      uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    }
    else if (BVar6 == BOM_UTF16LE) {
      uVar9 = (uint)(ushort)((ushort)uVar9 << 8 | (ushort)uVar9 >> 8);
    }
    if (uVar9 == 0xd) {
      bVar5 = false;
    }
    else {
      if (uVar9 < 0x100) {
        iVar8 = isprint(uVar9);
        if ((byte)(uVar9 == 10 & (byte)local_52c | (uVar9 == 9 || iVar8 != 0)) != 1)
        goto LAB_00176d86;
        std::__cxx11::string::push_back((char)&output);
      }
      else {
LAB_00176d86:
        if (BVar6 == BOM_UTF8) {
          uVar16 = 0;
          for (uVar13 = 0; (uVar16 == 0 && (uVar13 < 3)); uVar13 = uVar13 + 1) {
            if ((HandleStringsCommand::utf8_check_table[uVar13][0] & uVar9) ==
                (uint)HandleStringsCommand::utf8_check_table[uVar13][1]) {
              uVar16 = (int)uVar13 + 2;
            }
            else {
              uVar16 = 0;
            }
          }
          for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
            if ((uVar10 != 0) &&
               ((uVar9 = std::istream::get(), (uVar9 & 0xc0) != 0x80 ||
                ((*(uint *)((long)auStack_308 + *(long *)(_fin + -0x18)) & 5) != 0)))) {
              std::istream::putback(cVar17);
              break;
            }
            std::__cxx11::string::push_back((char)&output);
          }
          if (output._M_string_length != uVar16) {
            for (uVar16 = 0; (ulong)uVar16 < output._M_string_length - 1; uVar16 = uVar16 + 1) {
              uVar9 = (uint)output._M_dataplus._M_p[~(ulong)uVar16 + output._M_string_length];
              std::istream::putback(cVar17);
            }
            output._M_string_length = 0;
            *output._M_dataplus._M_p = '\0';
          }
        }
      }
      if (uVar9 == 10 && (local_52c & 1) == 0) {
        if ((s._M_string_length < uVar12) ||
           (((local_544 & 1) != 0 &&
            (bVar5 = cmsys::RegularExpression::find(&regex,s._M_dataplus._M_p), !bVar5)))) {
LAB_00176f82:
          s._M_string_length = 0;
          *s._M_dataplus._M_p = '\0';
          goto LAB_00176f96;
        }
        uVar16 = (int)local_540 + (int)s._M_string_length + 1;
        local_540 = (ulong)uVar16;
        if ((limit_output < 0) || (bVar5 = true, (int)uVar16 < limit_output)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&strings,&s);
          goto LAB_00176f82;
        }
      }
      else {
        if (output._M_string_length == 0) {
          if ((s._M_string_length != 0 && uVar12 <= s._M_string_length) &&
             (((local_544 & 1) == 0 ||
              (bVar5 = cmsys::RegularExpression::find(&regex,s._M_dataplus._M_p), bVar5)))) {
            uVar16 = (int)local_540 + (int)s._M_string_length + 1;
            local_540 = (ulong)uVar16;
            if ((-1 < limit_output) && (bVar5 = true, limit_output <= (int)uVar16))
            goto LAB_00177016;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&strings,&s);
          }
          goto LAB_00176f82;
        }
        std::__cxx11::string::append((string *)&s);
LAB_00176f96:
        bVar5 = false;
        if (((uint)local_508 == 0) || (s._M_string_length != local_508)) goto LAB_0017702a;
        if (local_530 <= (uint)local_508) {
          uVar16 = (uint)local_508;
          if ((local_544 & 1) != 0) {
            bVar5 = cmsys::RegularExpression::find(&regex,s._M_dataplus._M_p);
            if (!bVar5) goto LAB_00177014;
            uVar16 = (uint)s._M_string_length;
          }
          uVar16 = (int)local_540 + uVar16 + 1;
          local_540 = (ulong)uVar16;
          if ((-1 < limit_output) && (bVar5 = true, limit_output <= (int)uVar16)) goto LAB_00177016;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&strings,&s);
        }
LAB_00177014:
        bVar5 = false;
      }
LAB_00177016:
      s._M_string_length = 0;
      *s._M_dataplus._M_p = '\0';
    }
LAB_0017702a:
    std::__cxx11::string::~string((string *)&output);
  } while (!bVar5);
  if ((int)local_500 == 0) {
    iVar8 = (int)local_540;
LAB_0017706f:
    if ((((s._M_string_length != 0) && (uVar12 <= s._M_string_length)) &&
        (((local_544 & 1) == 0 ||
         (bVar5 = cmsys::RegularExpression::find(&regex,s._M_dataplus._M_p), bVar5)))) &&
       ((limit_output < 0 || ((int)((uint)s._M_string_length + iVar8 + 1) < limit_output)))) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&strings,&s);
    }
  }
  else {
    uVar13 = (long)strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
LAB_00177051:
    iVar8 = (int)local_540;
    if (uVar13 < local_500) goto LAB_0017706f;
  }
  pbVar1 = strings.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  for (pbVar22 = strings.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar22 != pbVar1; pbVar22 = pbVar22 + 1
      ) {
    std::__cxx11::string::append((char *)&output);
    pcVar2 = (pbVar22->_M_dataplus)._M_p;
    sVar3 = pbVar22->_M_string_length;
    for (sVar18 = 0; sVar3 != sVar18; sVar18 = sVar18 + 1) {
      cVar17 = (char)&output;
      if (pcVar2[sVar18] == ';') {
        std::__cxx11::string::push_back(cVar17);
      }
      std::__cxx11::string::push_back(cVar17);
    }
  }
  cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&outVar,output._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&s);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&strings);
LAB_00177196:
  std::ifstream::~ifstream(&fin);
LAB_001771a3:
  cmsys::RegularExpression::~RegularExpression(&regex);
  std::__cxx11::string::~string((string *)&outVar);
  std::__cxx11::string::~string((string *)&fileName);
  return bVar4;
}

Assistant:

bool cmFileCommand::HandleStringsCommand(std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError("STRINGS requires a file name and output variable");
    return false;
  }

  // Get the file to read.
  std::string fileName = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + args[1];
  }

  // Get the variable in which to store the results.
  std::string outVar = args[2];

  // Parse the options.
  enum
  {
    arg_none,
    arg_limit_input,
    arg_limit_output,
    arg_limit_count,
    arg_length_minimum,
    arg_length_maximum,
    arg__maximum,
    arg_regex,
    arg_encoding
  };
  unsigned int minlen = 0;
  unsigned int maxlen = 0;
  int limit_input = -1;
  int limit_output = -1;
  unsigned int limit_count = 0;
  cmsys::RegularExpression regex;
  bool have_regex = false;
  bool newline_consume = false;
  bool hex_conversion_enabled = true;
  enum
  {
    encoding_none = cmsys::FStream::BOM_None,
    encoding_utf8 = cmsys::FStream::BOM_UTF8,
    encoding_utf16le = cmsys::FStream::BOM_UTF16LE,
    encoding_utf16be = cmsys::FStream::BOM_UTF16BE,
    encoding_utf32le = cmsys::FStream::BOM_UTF32LE,
    encoding_utf32be = cmsys::FStream::BOM_UTF32BE
  };
  int encoding = encoding_none;
  int arg_mode = arg_none;
  for (unsigned int i = 3; i < args.size(); ++i) {
    if (args[i] == "LIMIT_INPUT") {
      arg_mode = arg_limit_input;
    } else if (args[i] == "LIMIT_OUTPUT") {
      arg_mode = arg_limit_output;
    } else if (args[i] == "LIMIT_COUNT") {
      arg_mode = arg_limit_count;
    } else if (args[i] == "LENGTH_MINIMUM") {
      arg_mode = arg_length_minimum;
    } else if (args[i] == "LENGTH_MAXIMUM") {
      arg_mode = arg_length_maximum;
    } else if (args[i] == "REGEX") {
      arg_mode = arg_regex;
    } else if (args[i] == "NEWLINE_CONSUME") {
      newline_consume = true;
      arg_mode = arg_none;
    } else if (args[i] == "NO_HEX_CONVERSION") {
      hex_conversion_enabled = false;
      arg_mode = arg_none;
    } else if (args[i] == "ENCODING") {
      arg_mode = arg_encoding;
    } else if (arg_mode == arg_limit_input) {
      if (sscanf(args[i].c_str(), "%d", &limit_input) != 1 ||
          limit_input < 0) {
        std::ostringstream e;
        e << "STRINGS option LIMIT_INPUT value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_output) {
      if (sscanf(args[i].c_str(), "%d", &limit_output) != 1 ||
          limit_output < 0) {
        std::ostringstream e;
        e << "STRINGS option LIMIT_OUTPUT value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_count) {
      int count;
      if (sscanf(args[i].c_str(), "%d", &count) != 1 || count < 0) {
        std::ostringstream e;
        e << "STRINGS option LIMIT_COUNT value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      limit_count = count;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_minimum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        std::ostringstream e;
        e << "STRINGS option LENGTH_MINIMUM value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      minlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_maximum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        std::ostringstream e;
        e << "STRINGS option LENGTH_MAXIMUM value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      maxlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_regex) {
      if (!regex.compile(args[i])) {
        std::ostringstream e;
        e << "STRINGS option REGEX value \"" << args[i]
          << "\" could not be compiled.";
        this->SetError(e.str());
        return false;
      }
      have_regex = true;
      arg_mode = arg_none;
    } else if (arg_mode == arg_encoding) {
      if (args[i] == "UTF-8") {
        encoding = encoding_utf8;
      } else if (args[i] == "UTF-16LE") {
        encoding = encoding_utf16le;
      } else if (args[i] == "UTF-16BE") {
        encoding = encoding_utf16be;
      } else if (args[i] == "UTF-32LE") {
        encoding = encoding_utf32le;
      } else if (args[i] == "UTF-32BE") {
        encoding = encoding_utf32be;
      } else {
        std::ostringstream e;
        e << "STRINGS option ENCODING \"" << args[i] << "\" not recognized.";
        this->SetError(e.str());
        return false;
      }
      arg_mode = arg_none;
    } else {
      std::ostringstream e;
      e << "STRINGS given unknown argument \"" << args[i] << "\"";
      this->SetError(e.str());
      return false;
    }
  }

  if (hex_conversion_enabled) {
    // TODO: should work without temp file, but just on a memory buffer
    std::string binaryFileName = this->Makefile->GetCurrentBinaryDirectory();
    binaryFileName += "/CMakeFiles";
    binaryFileName += "/FileCommandStringsBinaryFile";
    if (cmHexFileConverter::TryConvert(fileName.c_str(),
                                       binaryFileName.c_str())) {
      fileName = binaryFileName;
    }
  }

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(fileName.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(fileName.c_str());
#endif
  if (!fin) {
    std::ostringstream e;
    e << "STRINGS file \"" << fileName << "\" cannot be read.";
    this->SetError(e.str());
    return false;
  }

  // If BOM is found and encoding was not specified, use the BOM
  int bom_found = cmsys::FStream::ReadBOM(fin);
  if (encoding == encoding_none && bom_found != cmsys::FStream::BOM_None) {
    encoding = bom_found;
  }

  unsigned int bytes_rem = 0;
  if (encoding == encoding_utf16le || encoding == encoding_utf16be) {
    bytes_rem = 1;
  }
  if (encoding == encoding_utf32le || encoding == encoding_utf32be) {
    bytes_rem = 3;
  }

  // Parse strings out of the file.
  int output_size = 0;
  std::vector<std::string> strings;
  std::string s;
  while ((!limit_count || strings.size() < limit_count) &&
         (limit_input < 0 || static_cast<int>(fin.tellg()) < limit_input) &&
         fin) {
    std::string current_str;

    int c = fin.get();
    for (unsigned int i = 0; i < bytes_rem; ++i) {
      int c1 = fin.get();
      if (!fin) {
        fin.putback(static_cast<char>(c1));
        break;
      }
      c = (c << 8) | c1;
    }
    if (encoding == encoding_utf16le) {
      c = ((c & 0xFF) << 8) | ((c & 0xFF00) >> 8);
    } else if (encoding == encoding_utf32le) {
      c = (((c & 0xFF) << 24) | ((c & 0xFF00) << 8) | ((c & 0xFF0000) >> 8) |
           ((c & 0xFF000000) >> 24));
    }

    if (c == '\r') {
      // Ignore CR character to make output always have UNIX newlines.
      continue;
    }

    if (c >= 0 && c <= 0xFF &&
        (isprint(c) || c == '\t' || (c == '\n' && newline_consume))) {
      // This is an ASCII character that may be part of a string.
      // Cast added to avoid compiler warning. Cast is ok because
      // c is guaranteed to fit in char by the above if...
      current_str += static_cast<char>(c);
    } else if (encoding == encoding_utf8) {
      // Check for UTF-8 encoded string (up to 4 octets)
      static const unsigned char utf8_check_table[3][2] = {
        { 0xE0, 0xC0 },
        { 0xF0, 0xE0 },
        { 0xF8, 0xF0 },
      };

      // how many octets are there?
      unsigned int num_utf8_bytes = 0;
      for (unsigned int j = 0; num_utf8_bytes == 0 && j < 3; j++) {
        if ((c & utf8_check_table[j][0]) == utf8_check_table[j][1]) {
          num_utf8_bytes = j + 2;
        }
      }

      // get subsequent octets and check that they are valid
      for (unsigned int j = 0; j < num_utf8_bytes; j++) {
        if (j != 0) {
          c = fin.get();
          if (!fin || (c & 0xC0) != 0x80) {
            fin.putback(static_cast<char>(c));
            break;
          }
        }
        current_str += static_cast<char>(c);
      }

      // if this was an invalid utf8 sequence, discard the data, and put
      // back subsequent characters
      if ((current_str.length() != num_utf8_bytes)) {
        for (unsigned int j = 0; j < current_str.size() - 1; j++) {
          c = current_str[current_str.size() - 1 - j];
          fin.putback(static_cast<char>(c));
        }
        current_str.clear();
      }
    }

    if (c == '\n' && !newline_consume) {
      // The current line has been terminated.  Check if the current
      // string matches the requirements.  The length may now be as
      // low as zero since blank lines are allowed.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else if (current_str.empty()) {
      // A non-string character has been found.  Check if the current
      // string matches the requirements.  We require that the length
      // be at least one no matter what the user specified.
      if (s.length() >= minlen && !s.empty() &&
          (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else {
      s += current_str;
    }

    if (maxlen > 0 && s.size() == maxlen) {
      // Terminate a string if the maximum length is reached.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }
      s.clear();
    }
  }

  // If there is a non-empty current string we have hit the end of the
  // input file or the input size limit.  Check if the current string
  // matches the requirements.
  if ((!limit_count || strings.size() < limit_count) && !s.empty() &&
      s.length() >= minlen && (!have_regex || regex.find(s))) {
    output_size += static_cast<int>(s.size()) + 1;
    if (limit_output < 0 || output_size < limit_output) {
      strings.push_back(s);
    }
  }

  // Encode the result in a CMake list.
  const char* sep = "";
  std::string output;
  for (std::string const& sr : strings) {
    // Separate the strings in the output to make it a list.
    output += sep;
    sep = ";";

    // Store the string in the output, but escape semicolons to
    // make sure it is a list.
    for (char i : sr) {
      if (i == ';') {
        output += '\\';
      }
      output += i;
    }
  }

  // Save the output in a makefile variable.
  this->Makefile->AddDefinition(outVar, output.c_str());
  return true;
}